

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void test_basics<vector_brodnik<unsigned_long>>(void)

{
  uint __line;
  ostream *poVar1;
  unsigned_long uVar2;
  size_t sVar3;
  char *__assertion;
  size_t sVar4;
  uint i;
  unsigned_long local_60;
  vector_brodnik<unsigned_long> v;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,
                           "void test_basics() [Container = vector_brodnik<unsigned long>]");
  std::endl<char,std::char_traits<char>>(poVar1);
  vector_brodnik<unsigned_long>::vector_brodnik(&v);
  if ((long)(2 << (v._superblock & 0x1f)) + -0x40 ==
      v._left_in_superblock * v._block_size + v._left_in_block) {
    vector_brodnik<unsigned_long>::~vector_brodnik(&v);
    vector_brodnik<unsigned_long>::vector_brodnik(&v);
    local_60 = 1;
    vector_brodnik<unsigned_long>::push_back(&v,&local_60);
    if ((long)(2 << (v._superblock & 0x1f)) -
        (v._left_in_superblock * v._block_size + v._left_in_block) == 0x41) {
      uVar2 = vector_brodnik<unsigned_long>::operator[](&v,0);
      if (uVar2 == 1) {
        vector_brodnik<unsigned_long>::~vector_brodnik(&v);
        vector_brodnik<unsigned_long>::vector_brodnik(&v);
        sVar4 = 0xffffffffffffffff;
        while (sVar3 = ((long)(2 << (v._superblock & 0x1f)) -
                       (v._left_in_superblock * v._block_size + v._left_in_block)) - 0x40,
              sVar4 != 999999) {
          sVar4 = sVar4 + 1;
          if (sVar4 != sVar3) {
            __assertion = "v.size()==i";
            __line = 0x2b;
            goto LAB_00126c8f;
          }
          local_60 = sVar4;
          vector_brodnik<unsigned_long>::push_back(&v,&local_60);
          uVar2 = vector_brodnik<unsigned_long>::operator[](&v,sVar4);
          if (sVar4 != (uVar2 & 0xffffffff)) goto code_r0x00126a56;
        }
        if (sVar3 != 1000000) {
          __assertion = "v.size()==N";
          __line = 0x2f;
          goto LAB_00126c8f;
        }
        vector_brodnik<unsigned_long>::~vector_brodnik(&v);
        vector_brodnik<unsigned_long>::vector_brodnik(&v);
        for (sVar4 = 0; sVar4 != 1000000; sVar4 = sVar4 + 1) {
          local_60 = sVar4;
          vector_brodnik<unsigned_long>::push_back(&v,&local_60);
        }
        sVar4 = 0xffffffffffffffff;
        while (sVar4 != 999999) {
          sVar4 = sVar4 + 1;
          uVar2 = vector_brodnik<unsigned_long>::operator[](&v,sVar4);
          if (sVar4 != (uVar2 & 0xffffffff)) {
            __assertion = "unsigned(v[i])==i";
            __line = 0x35;
            goto LAB_00126c8f;
          }
        }
        vector_brodnik<unsigned_long>::clear(&v);
        if ((long)(2 << (v._superblock & 0x1f)) + -0x40 ==
            v._left_in_superblock * v._block_size + v._left_in_block) {
          for (sVar4 = 0; sVar4 != 1000000; sVar4 = sVar4 + 1) {
            local_60 = sVar4;
            vector_brodnik<unsigned_long>::push_back(&v,&local_60);
          }
          sVar4 = 0xffffffffffffffff;
          do {
            if (sVar4 == 999999) {
              vector_brodnik<unsigned_long>::clear(&v);
              if ((long)(2 << (v._superblock & 0x1f)) + -0x40 ==
                  v._left_in_superblock * v._block_size + v._left_in_block) {
                for (sVar4 = 0; sVar4 != 1000000; sVar4 = sVar4 + 1) {
                  local_60 = sVar4;
                  vector_brodnik<unsigned_long>::push_back(&v,&local_60);
                }
                sVar4 = 0xffffffffffffffff;
                while (sVar4 != 999999) {
                  sVar4 = sVar4 + 1;
                  uVar2 = vector_brodnik<unsigned_long>::operator[](&v,sVar4);
                  if (sVar4 != (uVar2 & 0xffffffff)) {
                    __assertion = "unsigned(v[i])==i";
                    __line = 0x3d;
                    goto LAB_00126c8f;
                  }
                }
                vector_brodnik<unsigned_long>::clear(&v);
                if ((long)(2 << (v._superblock & 0x1f)) + -0x40 ==
                    v._left_in_superblock * v._block_size + v._left_in_block) {
                  vector_brodnik<unsigned_long>::~vector_brodnik(&v);
                  return;
                }
                __assertion = "v.size()==0";
                __line = 0x3f;
              }
              else {
                __assertion = "v.size()==0";
                __line = 0x3b;
              }
              goto LAB_00126c8f;
            }
            sVar4 = sVar4 + 1;
            uVar2 = vector_brodnik<unsigned_long>::operator[](&v,sVar4);
          } while (sVar4 == (uVar2 & 0xffffffff));
          __assertion = "unsigned(v[i])==i";
          __line = 0x39;
        }
        else {
          __assertion = "v.size()==0";
          __line = 0x37;
        }
      }
      else {
        __assertion = "v[0]==1";
        __line = 0x25;
      }
    }
    else {
      __assertion = "v.size()==1";
      __line = 0x24;
    }
  }
  else {
    __assertion = "v.size()==0";
    __line = 0x1f;
  }
LAB_00126c8f:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/unit-test/main.cpp"
                ,__line,"void test_basics() [Container = vector_brodnik<unsigned long>]");
code_r0x00126a56:
  __assertion = "unsigned(v[i])==i";
  __line = 0x2d;
  goto LAB_00126c8f;
}

Assistant:

void test_basics()
{
	std::cerr<<__PRETTY_FUNCTION__<<std::endl;
	{
		Container v;
		assert(v.size()==0);
	}
	{
		Container v;
		v.push_back(1);
		assert(v.size()==1);
		assert(v[0]==1);
	}
	{
		Container v;
		const unsigned N=1000000;
		for (unsigned i=0; i < N; ++i) {
			assert(v.size()==i);
			v.push_back(i);
			assert(unsigned(v[i])==i);
		}
		assert(v.size()==N);
	}
	{
		Container v;
		const unsigned N=1000000;
		for (unsigned i=0; i < N; ++i) v.push_back(i);
		for (unsigned i=0; i < N; ++i) assert(unsigned(v[i])==i);
		v.clear();
		assert(v.size()==0);
		for (unsigned i=0; i < N; ++i) v.push_back(i);
		for (unsigned i=0; i < N; ++i) assert(unsigned(v[i])==i);
		v.clear();
		assert(v.size()==0);
		for (unsigned i=0; i < N; ++i) v.push_back(i);
		for (unsigned i=0; i < N; ++i) assert(unsigned(v[i])==i);
		v.clear();
		assert(v.size()==0);
	}
}